

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

MapIterator * __thiscall
google::protobuf::Reflection::MapEnd
          (MapIterator *__return_storage_ptr__,Reflection *this,Message *message,
          FieldDescriptor *field)

{
  LogMessage *other;
  LogFinisher local_6d [13];
  LogMessage local_60;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  MapIterator *iter;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  this_local = (Reflection *)__return_storage_ptr__;
  internal::LogMessage::LogMessage
            (&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
             ,0xef);
  other = internal::LogMessage::operator<<(&local_60,"Unimplemented Map Reflection API.");
  internal::LogFinisher::operator=(local_6d,other);
  internal::LogMessage::~LogMessage(&local_60);
  MapIterator::MapIterator(__return_storage_ptr__,(Message *)field_local,local_28);
  return __return_storage_ptr__;
}

Assistant:

MapIterator Reflection::MapEnd(
    Message* message,
    const FieldDescriptor* field) const {
  GOOGLE_LOG(FATAL) << "Unimplemented Map Reflection API.";
  MapIterator iter(message, field);
  return iter;
}